

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O3

tuple<unsigned_int,_int> __thiscall binary::binUvarint(binary *this,Bytes *buf)

{
  byte bVar1;
  pointer puVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  puVar2 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar7 != 0) {
    uVar5 = 0;
    uVar6 = 0;
    bVar3 = 0;
    do {
      bVar1 = puVar2[uVar5];
      if (-1 < (char)bVar1) {
        if ((8 < uVar5) && (1 < bVar1)) {
          uVar4 = ~(uint)uVar5;
          goto LAB_001103fb;
        }
        uVar6 = (uint)bVar1 << (bVar3 & 0x1f) | uVar6;
        uVar4 = (uint)uVar5 + 1;
        goto LAB_001103fd;
      }
      uVar6 = uVar6 | (bVar1 & 0x7f) << (bVar3 & 0x1f);
      bVar3 = bVar3 + 7;
      uVar5 = uVar5 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar5);
  }
  uVar4 = 0;
LAB_001103fb:
  uVar6 = 0;
LAB_001103fd:
  *(uint *)this = uVar4;
  *(uint *)(this + 4) = uVar6;
  return (tuple<unsigned_int,_int>)(_Tuple_impl<0UL,_unsigned_int,_int>)this;
}

Assistant:

std::tuple<UInt, int> binUvarint(const Bytes &buf) {
	UInt x{};
	UInt s{};

	for (int i = 0; i < buf.size(); i++) {
		unsigned char b = buf.at(i);
		if (b < 0x80) {
			if (i >= 9 && b > 1) {
				return {0, -(i + 1)}; // overflow
			}
			return {x | UInt(b) << s, i + 1};
		}
		x |= UInt(b & 0x7f) << s;
		s += 7;
	}
	return {0, 0};
}